

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool __thiscall ON_CheckSum::SetFileCheckSum(ON_CheckSum *this,FILE *fp)

{
  bool bVar1;
  size_t sVar2;
  int local_454;
  long lStack_450;
  int i;
  size_t maxsize;
  size_t sz0;
  ON__INT32 crc;
  int count;
  uchar buffer [1024];
  time_t local_30;
  time_t filetime;
  size_t filesize;
  FILE *pFStack_18;
  bool rc;
  FILE *fp_local;
  ON_CheckSum *this_local;
  
  filesize._7_1_ = 0;
  pFStack_18 = (FILE *)fp;
  fp_local = (FILE *)this;
  Zero(this);
  if (pFStack_18 != (FILE *)0x0) {
    filetime = 0;
    local_30 = 0;
    bVar1 = ON::GetFileStats((FILE *)pFStack_18,(size_t *)&filetime,(time_t *)0x0,&local_30);
    if (bVar1) {
      this->m_time = local_30;
    }
    sz0._4_4_ = 0x400;
    sz0._0_4_ = 0;
    maxsize = 0;
    lStack_450 = 0x40000;
    for (local_454 = 0; local_454 < 7; local_454 = local_454 + 1) {
      maxsize = lStack_450 + maxsize;
      while( true ) {
        bVar1 = false;
        if (sz0._4_4_ == 0x400) {
          bVar1 = this->m_size < maxsize;
        }
        if (!bVar1) break;
        sVar2 = fread(&crc,1,0x400,pFStack_18);
        sz0._4_4_ = (int)sVar2;
        if (0 < sz0._4_4_) {
          this->m_size = (long)sz0._4_4_ + this->m_size;
          sz0._0_4_ = ON_CRC32((ON__UINT32)sz0,(long)sz0._4_4_,&crc);
        }
      }
      lStack_450 = lStack_450 << 1;
      this->m_crc[local_454] = (ON__UINT32)sz0;
    }
    while (sz0._4_4_ == 0x400) {
      sVar2 = fread(&crc,1,0x400,pFStack_18);
      sz0._4_4_ = (int)sVar2;
      if (0 < sz0._4_4_) {
        this->m_size = (long)sz0._4_4_ + this->m_size;
        sz0._0_4_ = ON_CRC32((ON__UINT32)sz0,(long)sz0._4_4_,&crc);
      }
    }
    this->m_crc[7] = (ON__UINT32)sz0;
    filesize._7_1_ = filetime == this->m_size;
  }
  return (bool)(filesize._7_1_ & 1);
}

Assistant:

bool ON_CheckSum::SetFileCheckSum( FILE* fp )
{
  bool rc = false;
  Zero();
  if ( fp )
  {
    size_t filesize = 0;
    time_t filetime = 0;
    if ( ON::GetFileStats(fp,&filesize,nullptr,&filetime) )
    {
      m_time = filetime;
    }

    unsigned char buffer[1024];
    int count=1024;
    ON__INT32 crc = 0;
    size_t sz0 = 0, maxsize = 0x40000;

    for( int i = 0; i < 7; i++ )
    {
      sz0 += maxsize;
      while(1024 == count && m_size < sz0)
      {
        count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
        if ( count > 0 )
        {
          m_size += count;
          crc = ON_CRC32( crc, count, buffer );
        }
      }
      maxsize *= 2;
      m_crc[i] = crc;
    }

    while(1024 == count)
    {
      count = (int)fread( buffer, 1, 1024, fp ); // the (int) is for 64 bit size_t conversion
      if ( count > 0 )
      {
        m_size += count;
        crc = ON_CRC32( crc, count, buffer );
      }
    }
    m_crc[7] = crc;

    rc = (filesize == m_size);
  }
  return rc;
}